

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

iterator __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>::
operator()(arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
           *this,char_type *value)

{
  char cVar1;
  undefined8 extraout_RDX;
  undefined8 uVar2;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  iterator iVar3;
  arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
  *local_18;
  char_type *local_10;
  
  if (this->specs_ != (format_specs *)0x0) {
    cVar1 = (this->specs_->super_core_format_specs).type;
    local_18 = this;
    local_10 = value;
    if (cVar1 != 's') {
      if (cVar1 == 'p') {
        write_pointer(this,value);
        uVar2 = extraout_RDX_00;
        goto LAB_001ecbbe;
      }
      if (cVar1 != '\0') {
        error_handler::on_error((error_handler *)&local_18,"invalid type specifier");
        uVar2 = extraout_RDX_01;
        goto LAB_001ecbbe;
      }
    }
  }
  write(this,value);
  uVar2 = extraout_RDX;
LAB_001ecbbe:
  iVar3._9_7_ = (undefined7)((ulong)uVar2 >> 8);
  iVar3.blackhole_ = (this->writer_).out_.blackhole_;
  iVar3.count_ = (this->writer_).out_.count_;
  return iVar3;
}

Assistant:

iterator operator()(const char_type *value) {
    if (!specs_) return write(value), out();
    internal::handle_cstring_type_spec(
          specs_->type, cstring_spec_handler(*this, value));
    return out();
  }